

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_export_bits(void)

{
  uint chunk_size;
  unsigned_long uVar1;
  unsigned_short *puVar2;
  uint *__first2;
  uintwide_t<256U,_unsigned_short,_void,_false> *x;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_01;
  int in_R8D;
  size_type __n;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  byte local_ed;
  undefined2 local_ec;
  allocator_type local_e9;
  local_output_array_type bits_result_from_uintwide_t;
  uint local_c8 [2];
  long local_c0;
  local_output_array_type bits_result_from_boost;
  uintwide_t<256U,_unsigned_short,_void,_false> val_uintwide_t;
  local_boost_small_uint_type val_boost;
  
  uVar1 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
          *)eng_sgn,uVar1);
  uVar1 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
          *)eng_dig,uVar1);
  local_ed = 1;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    iVar3 = 0x40;
    while( true ) {
      bVar6 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar6) break;
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&val_uintwide_t,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)&bits_result_from_uintwide_t,(wide_integer *)&val_uintwide_t,x);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::number<std::__cxx11::string>
                ((number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                  *)&val_boost,(string *)&bits_result_from_uintwide_t,(type *)0x0);
      std::__cxx11::string::~string((string *)&bits_result_from_uintwide_t);
      bits_result_from_uintwide_t._M_elems[8] = 0;
      bits_result_from_uintwide_t._M_elems[9] = 0;
      bits_result_from_uintwide_t._M_elems[10] = 0;
      bits_result_from_uintwide_t._M_elems[0xb] = 0;
      bits_result_from_uintwide_t._M_elems[0xc] = 0;
      bits_result_from_uintwide_t._M_elems[0xd] = 0;
      bits_result_from_uintwide_t._M_elems[0xe] = 0;
      bits_result_from_uintwide_t._M_elems[0xf] = 0;
      bits_result_from_uintwide_t._M_elems[0] = 0;
      bits_result_from_uintwide_t._M_elems[1] = 0;
      bits_result_from_uintwide_t._M_elems[2] = 0;
      bits_result_from_uintwide_t._M_elems[3] = 0;
      bits_result_from_uintwide_t._M_elems[4] = 0;
      bits_result_from_uintwide_t._M_elems[5] = 0;
      bits_result_from_uintwide_t._M_elems[6] = 0;
      bits_result_from_uintwide_t._M_elems[7] = 0;
      bits_result_from_boost._M_elems[8] = 0;
      bits_result_from_boost._M_elems[9] = 0;
      bits_result_from_boost._M_elems[10] = 0;
      bits_result_from_boost._M_elems[0xb] = 0;
      bits_result_from_boost._M_elems[0xc] = 0;
      bits_result_from_boost._M_elems[0xd] = 0;
      bits_result_from_boost._M_elems[0xe] = 0;
      bits_result_from_boost._M_elems[0xf] = 0;
      bits_result_from_boost._M_elems[0] = 0;
      bits_result_from_boost._M_elems[1] = 0;
      bits_result_from_boost._M_elems[2] = 0;
      bits_result_from_boost._M_elems[3] = 0;
      bits_result_from_boost._M_elems[4] = 0;
      bits_result_from_boost._M_elems[5] = 0;
      bits_result_from_boost._M_elems[6] = 0;
      bits_result_from_boost._M_elems[7] = 0;
      bVar6 = test_import_bits::msv_options._M_elems[lVar4];
      math::wide_integer::export_bits<unsigned_short_*,_256U,_unsigned_short,_void,_false,_nullptr>
                (&val_uintwide_t,(unsigned_short *)&bits_result_from_uintwide_t,0x10,bVar6);
      puVar2 = (unsigned_short *)(ulong)bVar6;
      boost::multiprecision::
      export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short*>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&val_boost,bits_result_from_boost._M_elems,0x10,bVar6);
      bVar6 = std::__equal<true>::equal<unsigned_short>
                        ((__equal<true> *)&bits_result_from_uintwide_t,(unsigned_short *)local_c8,
                         bits_result_from_boost._M_elems,puVar2);
      local_ed = local_ed & bVar6;
    }
  }
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
      iVar3 = 0x40;
      while( true ) {
        if (iVar3 == 0) break;
        generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                  (&val_uintwide_t,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
        math::wide_integer::to_string<256u,unsigned_short,void,false>
                  ((string *)&bits_result_from_uintwide_t,(wide_integer *)&val_uintwide_t,x_00);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
        ::number<std::__cxx11::string>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                    *)&val_boost,(string *)&bits_result_from_uintwide_t,(type *)0x0);
        local_c0 = CONCAT44(local_c0._4_4_,iVar3 + -1);
        std::__cxx11::string::~string((string *)&bits_result_from_uintwide_t);
        chunk_size = *(uint *)((long)test_import_bits::bits_for_chunks._M_elems + lVar5);
        __n = ((long)(int)(0x100 / (long)(int)chunk_size) + 1) -
              (ulong)((int)(0x100 % (long)(int)chunk_size) == 0);
        bits_result_from_boost._M_elems._0_8_ =
             bits_result_from_boost._M_elems._0_8_ & 0xffffffffffff0000;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &bits_result_from_uintwide_t,__n,bits_result_from_boost._M_elems,
                   (allocator_type *)&local_ec);
        local_ec = 0;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &bits_result_from_boost,__n,(value_type_conflict3 *)&local_ec,&local_e9);
        bVar6 = test_import_bits::msv_options._M_elems[lVar4];
        math::wide_integer::
        export_bits<__gnu_cxx::__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>,_256U,_unsigned_short,_void,_false,_nullptr>
                  (&val_uintwide_t,
                   (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                    )bits_result_from_uintwide_t._M_elems._0_8_,chunk_size,bVar6);
        puVar2 = (unsigned_short *)(ulong)bVar6;
        boost::multiprecision::
        export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                  (&val_boost,
                   (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                    )bits_result_from_boost._M_elems._0_8_,chunk_size,bVar6);
        bVar6 = std::__equal<true>::equal<unsigned_short>
                          ((__equal<true> *)bits_result_from_uintwide_t._M_elems._0_8_,
                           (unsigned_short *)bits_result_from_uintwide_t._M_elems._8_8_,
                           (unsigned_short *)bits_result_from_boost._M_elems._0_8_,puVar2);
        local_ed = local_ed & bVar6;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &bits_result_from_boost);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &bits_result_from_uintwide_t);
        iVar3 = (int)local_c0;
      }
    }
  }
  lVar4 = 0;
  while (lVar4 != 2) {
    iVar3 = 0x40;
    local_c0 = lVar4;
    while( true ) {
      bVar6 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar6) break;
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&val_uintwide_t,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)&bits_result_from_uintwide_t,(wide_integer *)&val_uintwide_t,x_01);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::number<std::__cxx11::string>
                ((number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                  *)&val_boost,(string *)&bits_result_from_uintwide_t,(type *)0x0);
      std::__cxx11::string::~string((string *)&bits_result_from_uintwide_t);
      bits_result_from_uintwide_t._M_elems[8] = 0;
      bits_result_from_uintwide_t._M_elems[9] = 0;
      bits_result_from_uintwide_t._M_elems[10] = 0;
      bits_result_from_uintwide_t._M_elems[0xb] = 0;
      bits_result_from_uintwide_t._M_elems[0xc] = 0;
      bits_result_from_uintwide_t._M_elems[0xd] = 0;
      bits_result_from_uintwide_t._M_elems[0xe] = 0;
      bits_result_from_uintwide_t._M_elems[0xf] = 0;
      bits_result_from_uintwide_t._M_elems[0] = 0;
      bits_result_from_uintwide_t._M_elems[1] = 0;
      bits_result_from_uintwide_t._M_elems[2] = 0;
      bits_result_from_uintwide_t._M_elems[3] = 0;
      bits_result_from_uintwide_t._M_elems[4] = 0;
      bits_result_from_uintwide_t._M_elems[5] = 0;
      bits_result_from_uintwide_t._M_elems[6] = 0;
      bits_result_from_uintwide_t._M_elems[7] = 0;
      bits_result_from_boost._M_elems[8] = 0;
      bits_result_from_boost._M_elems[9] = 0;
      bits_result_from_boost._M_elems[10] = 0;
      bits_result_from_boost._M_elems[0xb] = 0;
      bits_result_from_boost._M_elems[0xc] = 0;
      bits_result_from_boost._M_elems[0xd] = 0;
      bits_result_from_boost._M_elems[0xe] = 0;
      bits_result_from_boost._M_elems[0xf] = 0;
      bits_result_from_boost._M_elems[0] = 0;
      bits_result_from_boost._M_elems[1] = 0;
      bits_result_from_boost._M_elems[2] = 0;
      bits_result_from_boost._M_elems[3] = 0;
      bits_result_from_boost._M_elems[4] = 0;
      bits_result_from_boost._M_elems[5] = 0;
      bits_result_from_boost._M_elems[6] = 0;
      bits_result_from_boost._M_elems[7] = 0;
      bVar6 = test_import_bits::msv_options._M_elems[local_c0];
      math::wide_integer::export_bits<unsigned_int_*,_256U,_unsigned_short,_void,_false,_nullptr>
                (&val_uintwide_t,(uint *)&bits_result_from_uintwide_t,0x20,bVar6);
      __first2 = (uint *)(ulong)bVar6;
      boost::multiprecision::
      export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int*>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&val_boost,(uint *)&bits_result_from_boost,0x20,bVar6);
      bVar6 = std::__equal<true>::equal<unsigned_int>
                        ((__equal<true> *)&bits_result_from_uintwide_t,local_c8,
                         (uint *)&bits_result_from_boost,__first2);
      local_ed = local_ed & bVar6;
    }
    lVar4 = local_c0 + 1;
  }
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<int>
            ((uintwide_t<256U,_unsigned_short,_void,_true> *)&val_uintwide_t,-1,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  boost::multiprecision::backends::
  cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  ::cpp_int_base((cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                  *)&val_boost,1);
  bits_result_from_uintwide_t._M_elems._0_8_ =
       bits_result_from_uintwide_t._M_elems._0_8_ & 0xffffffff00000000;
  bits_result_from_boost._M_elems._0_8_ = bits_result_from_boost._M_elems._0_8_ & 0xffffffff00000000
  ;
  math::wide_integer::export_bits<unsigned_int_*,_256U,_unsigned_short,_void,_true,_nullptr>
            ((uintwide_t<256U,_unsigned_short,_void,_true> *)&val_uintwide_t,
             (uint *)&bits_result_from_uintwide_t,0x20,true);
  boost::multiprecision::
  export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int*>
            ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&val_boost,(uint *)&bits_result_from_boost,0x20,true);
  return (bool)((bits_result_from_boost._M_elems._0_4_ == 1 &&
                bits_result_from_uintwide_t._M_elems._0_4_ == 1) & local_ed);
}

Assistant:

auto test_export_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify export_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      using std::to_string;

            auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
      const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

      using local_output_array_type =
        std::array<local_input_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs>;

      using local_result_value_type = typename local_output_array_type::value_type;

      local_output_array_type bits_result_from_uintwide_t { };
      local_output_array_type bits_result_from_boost      { };

      static_cast<void>(export_bits(val_uintwide_t, bits_result_from_uintwide_t.begin(), static_cast<unsigned>(std::numeric_limits<local_result_value_type>::digits), msv_first));
      static_cast<void>(export_bits(val_boost,      bits_result_from_boost.begin(),      static_cast<unsigned>(std::numeric_limits<local_result_value_type>::digits), msv_first)); // NOLINT

      const auto result_export_bits_is_ok = std::equal(bits_result_from_uintwide_t.cbegin(),
                                                       bits_result_from_uintwide_t.cend(),
                                                       bits_result_from_boost.cbegin());

      result_is_ok = (result_export_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify export_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        using local_input_value_type = typename local_representation_type::value_type;

        using std::to_string;

              auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
        const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

        using local_output_vector_type = std::vector<local_input_value_type>;

        using local_result_value_type = typename local_output_vector_type::value_type;

        const auto output_distance_chunk_size_has_mod =
        (
          static_cast<int>
          (
            std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(chunk_size)
          ) != 0
        );

        const auto output_distance =
          static_cast<std::size_t>
          (
              static_cast<std::size_t>(std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(chunk_size))
            + static_cast<std::size_t>
              (
                output_distance_chunk_size_has_mod ? static_cast<std::size_t>(UINT8_C(1))
                                                   : static_cast<std::size_t>(UINT8_C(0))
              )
          );

        local_output_vector_type bits_result_from_uintwide_t(output_distance, static_cast<local_result_value_type>(UINT8_C(0)));
        local_output_vector_type bits_result_from_boost     (output_distance, static_cast<local_result_value_type>(UINT8_C(0)));

        static_cast<void>(export_bits(val_uintwide_t, bits_result_from_uintwide_t.begin(), chunk_size, msv_first));
        static_cast<void>(export_bits(val_boost,      bits_result_from_boost.begin(),      chunk_size, msv_first)); // NOLINT

        const auto result_export_bits_is_ok = std::equal(bits_result_from_uintwide_t.cbegin(),
                                                         bits_result_from_uintwide_t.cend(),
                                                         bits_result_from_boost.cbegin());

        result_is_ok = (result_export_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify export_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      using std::to_string;

            auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
      const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_result_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_result_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_output_array_type =
        std::array<local_result_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_output_array_type bits_result_double_width_from_uintwide_t { };
      local_double_width_output_array_type bits_result_double_width_from_boost      { };

      static_cast<void>(export_bits(val_uintwide_t, bits_result_double_width_from_uintwide_t.begin(), static_cast<unsigned>(std::numeric_limits<local_result_double_width_value_type>::digits), msv_first));
      static_cast<void>(export_bits(val_boost,      bits_result_double_width_from_boost.begin(),      static_cast<unsigned>(std::numeric_limits<local_result_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto result_export_bits_is_ok = std::equal(bits_result_double_width_from_uintwide_t.cbegin(),
                                                       bits_result_double_width_from_uintwide_t.cend(),
                                                       bits_result_double_width_from_boost.cbegin());

      result_is_ok = (result_export_bits_is_ok && result_is_ok);
    }
  }

  {
    // Note that export_bits uses the absolute value.
    // So test this feature by using negative one here.
    const auto val_uintwide_t = local_uintwide_t_small_signed_type(-1);
    const auto val_boost      = local_boost_small_uint_type(1);

    using local_result_type = std::uint32_t;

    auto result_one_uintwide_t = local_result_type { };
    auto result_one_boost      = local_result_type { };

    static_cast<void>(export_bits(val_uintwide_t, &result_one_uintwide_t, static_cast<unsigned>(std::numeric_limits<local_result_type>::digits)));
    static_cast<void>(export_bits(val_boost,      &result_one_boost,      static_cast<unsigned>(std::numeric_limits<local_result_type>::digits)));

    const auto result_is_one_and_compare_one_is_ok = (   (result_one_uintwide_t == result_one_boost)
                                                      && (result_one_uintwide_t == 1));

    result_is_ok = (result_is_one_and_compare_one_is_ok && result_is_ok);
  }

  return result_is_ok;
}